

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O0

void Js::SCAPropBag::CreateInstance(ScriptContext *scriptContext,SCAPropBag **ppInstance)

{
  HeapAllocator *alloc;
  SCAPropBag *this;
  TrackAllocData local_40;
  SCAPropBag **local_18;
  SCAPropBag **ppInstance_local;
  ScriptContext *scriptContext_local;
  
  local_18 = ppInstance;
  ppInstance_local = (SCAPropBag **)scriptContext;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCAPropBag.cpp"
             ,0x26);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
  this = (SCAPropBag *)new<Memory::HeapAllocator>(0x20,alloc,0x350bd0);
  SCAPropBag(this,(ScriptContext *)ppInstance_local);
  *local_18 = this;
  return;
}

Assistant:

void SCAPropBag::CreateInstance(ScriptContext* scriptContext, SCAPropBag** ppInstance)
    {
        *ppInstance = HeapNew(SCAPropBag, scriptContext);
    }